

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualStack.cpp
# Opt level: O0

Variable * __thiscall VirtualStack::pop(Variable *__return_storage_ptr__,VirtualStack *this)

{
  uint uVar1;
  string *this_00;
  allocator local_19;
  VirtualStack *local_18;
  VirtualStack *this_local;
  
  local_18 = this;
  this_local = (VirtualStack *)__return_storage_ptr__;
  if (this->stackOffset == 0) {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this_00,"Can\'t pop from virtual stack, stack empty",&local_19);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  uVar1 = this->stackOffset - 1;
  this->stackOffset = uVar1;
  Variable::Variable(__return_storage_ptr__,this->stack + uVar1);
  return __return_storage_ptr__;
}

Assistant:

Variable VirtualStack::pop()
{
   // std::cout << "\nPop type: " << dataTypeToString(stack[stackOffset-1].type) << ". Stack size: " << stackOffset-1;
    if(stackOffset == 0)
        throw std::string("Can't pop from virtual stack, stack empty");
    return stack[--stackOffset];
}